

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ShapeRange * __thiscall
CoreML::ShapeRange::operator*(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  RangeValue RVar1;
  ShapeRange *out;
  RangeValue local_58;
  RangeValue local_48;
  RangeValue local_38;
  RangeValue local_28;
  ShapeRange *local_18;
  ShapeRange *other_local;
  ShapeRange *this_local;
  
  local_18 = other;
  other_local = this;
  ShapeRange(__return_storage_ptr__);
  RVar1 = minimum(local_18);
  local_38._val = RVar1._val;
  local_38._isUnbound = RVar1._isUnbound;
  RVar1 = RangeValue::operator*(&this->_minimum,&local_38);
  local_28._val = RVar1._val;
  local_28._isUnbound = RVar1._isUnbound;
  setLower(__return_storage_ptr__,&local_28);
  RVar1 = maximum(local_18);
  local_58._val = RVar1._val;
  local_58._isUnbound = RVar1._isUnbound;
  RVar1 = RangeValue::operator*(&this->_maximum,&local_58);
  local_48._val = RVar1._val;
  local_48._isUnbound = RVar1._isUnbound;
  setUpper(__return_storage_ptr__,&local_48);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator* (const ShapeRange& other) const {
    ShapeRange out;
    out.setLower(_minimum * other.minimum());
    out.setUpper(_maximum * other.maximum());
    return out;
}